

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpainter.cpp
# Opt level: O1

QRectF * __thiscall
QPainter::boundingRect
          (QRectF *__return_storage_ptr__,QPainter *this,QRectF *r,QString *text,QTextOption *o)

{
  _Head_base<0UL,_QPainterPrivate_*,_false> _Var1;
  qreal qVar2;
  
  _Var1._M_head_impl =
       (this->d_ptr)._M_t.
       super___uniq_ptr_impl<QPainterPrivate,_std::default_delete<QPainterPrivate>_>._M_t.
       super__Tuple_impl<0UL,_QPainterPrivate_*,_std::default_delete<QPainterPrivate>_>.
       super__Head_base<0UL,_QPainterPrivate_*,_false>._M_head_impl;
  if (((tuple<QPaintEngine_*,_QPainterPrivate::QPaintEngineDestructor>)
       *(tuple<QPaintEngine_*,_QPainterPrivate::QPaintEngineDestructor> *)
        &((_Var1._M_head_impl)->engine)._M_t ==
       (__uniq_ptr_impl<QPaintEngine,_QPainterPrivate::QPaintEngineDestructor>)0x0) ||
     ((text->d).size == 0)) {
    qVar2 = r->yp;
    __return_storage_ptr__->xp = r->xp;
    __return_storage_ptr__->yp = qVar2;
    __return_storage_ptr__->w = 0.0;
    __return_storage_ptr__->h = 0.0;
  }
  else {
    __return_storage_ptr__->xp = 0.0;
    __return_storage_ptr__->yp = 0.0;
    __return_storage_ptr__->w = 0.0;
    __return_storage_ptr__->h = 0.0;
    qt_format_text((QFont *)((long)((_Var1._M_head_impl)->state)._M_t + 0x20),r,0x4000,o,text,
                   __return_storage_ptr__,0,(int *)0x0,0,this);
  }
  return __return_storage_ptr__;
}

Assistant:

QRectF QPainter::boundingRect(const QRectF &r, const QString &text, const QTextOption &o)
{
    Q_D(QPainter);

    if (!d->engine || text.size() == 0)
        return QRectF(r.x(),r.y(), 0,0);

    QRectF br;
    qt_format_text(d->state->font, r, Qt::TextDontPrint, &o, text, &br, 0, nullptr, 0, this);
    return br;
}